

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmHttpSplitURI(SyhttpUri *pOut,char *zUri,sxu32 nLen)

{
  uint *puVar1;
  char cVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  ulong uVar5;
  ushort **ppuVar6;
  long lVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  char *pcVar9;
  char *zStr;
  sxu32 sVar10;
  sxu32 nLen_00;
  char *zStr_00;
  int iVar11;
  char *zStr_01;
  SyhttpUri *pSVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  sxu32 nPos;
  sxu32 nPassOfft;
  sxu32 local_5c;
  SyhttpUri *local_58;
  char *local_50;
  char *local_48;
  uint local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,nLen);
  uVar8 = (ulong)nLen;
  local_50 = zUri + uVar8;
  local_5c = 0;
  uVar5 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&(pOut->sHost).zString + uVar5 + 4) = 0;
    uVar5 = uVar5 + 4;
  } while (uVar5 < 0x8c);
  (pOut->sRaw).zString = zUri;
  (pOut->sRaw).nByte = nLen;
  local_58 = pOut;
  local_48 = zUri;
  if (nLen != 0) {
    do {
      nLen = nLen - 1;
      cVar2 = *zUri;
      if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
         (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) == 0))
      {
        iVar11 = 0;
        uVar5 = uVar8;
        goto LAB_0012261c;
      }
      (local_58->sRaw).nByte = nLen;
      zUri = zUri + 1;
      (local_58->sRaw).zString = zUri;
      uVar8 = uVar8 - 1;
    } while (nLen != 0);
  }
  goto LAB_00122652;
  while( true ) {
    uVar5 = uVar5 - 1;
    (local_58->sRaw).nByte = (uint)uVar5;
    iVar11 = iVar11 + 1;
    nLen = nLen - 1;
    if ((int)uVar8 == iVar11) break;
LAB_0012261c:
    cVar2 = zUri[nLen];
    if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
       (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) == 0))
    break;
  }
LAB_00122652:
  zStr = local_48;
  sVar3 = SyByteFind(local_48,(sxu32)local_38,0x2f,&local_5c);
  pcVar9 = local_50;
  zStr_01 = local_50;
  pSVar12 = local_58;
  if (sVar3 != 0) goto LAB_00122685;
  zStr_01 = zStr + local_5c;
  if ((ulong)local_5c == 0) {
    if (zStr_01[1] != '/') goto LAB_001228c5;
LAB_00122932:
    pcVar9 = local_50;
    pSVar12 = local_58;
    zStr = zStr_01 + 2;
    sVar4 = SyByteFind(zStr,(int)local_50 - (int)zStr,0x2f,&local_5c);
    zStr_01 = pcVar9;
    if (sVar4 == 0) {
      zStr_01 = zStr + local_5c;
    }
  }
  else if (zStr_01[-1] == ':') {
    (local_58->sScheme).zString = local_48;
    (local_58->sScheme).nByte = local_5c - 1;
    if (local_5c - 1 != 0) {
      uVar14 = local_5c - 2;
      pcVar9 = local_48;
      do {
        cVar2 = *pcVar9;
        if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
           (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) == 0
           )) break;
        (local_58->sScheme).nByte = uVar14;
        (local_58->sScheme).zString = pcVar9 + 1;
        bVar15 = uVar14 != 0;
        uVar14 = uVar14 - 1;
        pcVar9 = pcVar9 + 1;
      } while (bVar15);
    }
    if (zStr_01[1] == '/') goto LAB_00122932;
    pcVar9 = local_50;
    pSVar12 = local_58;
    zStr = local_48;
    if (zStr_01[-1] == ':') goto LAB_001228c5;
  }
  else {
    zStr = local_48;
    if (zStr_01[1] == '/') goto LAB_00122932;
  }
LAB_00122685:
  iVar11 = (int)zStr_01;
  nLen_00 = iVar11 - (int)zStr;
  sVar4 = SyByteFind(zStr,nLen_00,0x40,&local_5c);
  sVar10 = local_5c;
  if (sVar4 == 0) {
    if (local_5c == 0) {
      zStr = zStr + 1;
      pcVar9 = local_50;
    }
    else {
      (pSVar12->sUser).zString = zStr;
      (pSVar12->sUser).nByte = local_5c;
      sVar4 = SyByteFind(zStr,nLen_00,0x3a,&local_3c);
      if ((sVar4 == 0) && (local_3c < sVar10)) {
        (pSVar12->sUser).nByte = local_3c;
        (pSVar12->sPass).zString = zStr + (ulong)local_3c + 1;
        (pSVar12->sPass).nByte = ~local_3c + sVar10;
      }
      zStr = zStr + (sVar10 + 1);
      pcVar9 = local_50;
    }
  }
  zStr_00 = zStr;
  if (zStr < zStr_01) {
    ppuVar6 = __ctype_b_loc();
    lVar7 = (long)zStr_01 - (long)zStr;
    do {
      zStr_00 = zStr;
      if ((*(byte *)((long)*ppuVar6 + (long)*zStr * 2 + 1) & 0x20) == 0) break;
      zStr = zStr + 1;
      lVar7 = lVar7 + -1;
      zStr_00 = zStr_01;
    } while (lVar7 != 0);
  }
  (pSVar12->sHost).zString = zStr_00;
  iVar13 = (int)zStr_00;
  sVar10 = iVar11 - iVar13;
  (pSVar12->sHost).nByte = sVar10;
  if (*zStr_00 == '[') {
    local_58 = (SyhttpUri *)CONCAT44(local_58._4_4_,sVar3);
    (pSVar12->sHost).zString = zStr_00 + 1;
    zStr_00 = zStr_00 + 2;
    uVar14 = 0;
    while( true ) {
      (pSVar12->sHost).nByte = uVar14;
      cVar2 = zStr_00[-1];
      if (((0xffffffffffffffbf < (ulong)(long)cVar2) ||
          (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x10) == 0)
          ) && (cVar2 != ':')) break;
      uVar14 = uVar14 + 1;
      zStr_00 = zStr_00 + 1;
    }
    if (cVar2 != ']') {
      return -0x18;
    }
    sVar4 = SyByteFind(zStr_00,((iVar11 - iVar13) - uVar14) - 2,0x3a,&local_5c);
    pcVar9 = local_50;
    sVar3 = (sxi32)local_58;
    if (sVar4 == 0) goto LAB_001228a8;
  }
  else {
    sVar4 = SyByteFind(zStr_00,sVar10,0x3a,&local_5c);
    if (sVar4 == 0) {
      (pSVar12->sHost).nByte = local_5c;
LAB_001228a8:
      (pSVar12->sPort).zString = zStr_00 + (local_5c + 1);
      (pSVar12->sPort).nByte = iVar11 - (int)(zStr_00 + (local_5c + 1));
    }
  }
  if (sVar3 != 0) {
    return 0;
  }
LAB_001228c5:
  (pSVar12->sPath).zString = zStr_01;
  iVar11 = (int)pcVar9;
  sVar10 = iVar11 - (int)zStr_01;
  (pSVar12->sPath).nByte = sVar10;
  if (sVar10 == 0) {
    return 0;
  }
  sVar3 = SyByteFind(zStr_01,sVar10,0x3f,&local_5c);
  if (sVar3 == 0) {
    (pSVar12->sPath).nByte = local_5c;
    (pSVar12->sQuery).zString = zStr_01 + (local_5c + 1);
    (pSVar12->sQuery).nByte = iVar11 - (int)(zStr_01 + (local_5c + 1));
    sVar3 = SyByteFind(zStr_01,sVar10,0x23,&local_5c);
    if (sVar3 != 0) {
      return 0;
    }
    if (zStr_01 + local_5c < (pSVar12->sQuery).zString) {
      return -0xc;
    }
    puVar1 = &(pSVar12->sQuery).nByte;
    *puVar1 = *puVar1 + ((int)(zStr_01 + local_5c) - iVar11);
  }
  else {
    sVar3 = SyByteFind(zStr_01,sVar10,0x23,&local_5c);
    if (sVar3 != 0) {
      return 0;
    }
    (pSVar12->sPath).nByte = local_5c;
  }
  (pSVar12->sFragment).zString = zStr_01 + (local_5c + 1);
  (pSVar12->sFragment).nByte = iVar11 - (int)(zStr_01 + (local_5c + 1));
  return 0;
}

Assistant:

static sxi32 VmHttpSplitURI(SyhttpUri *pOut, const char *zUri, sxu32 nLen)
 {
	 const char *zEnd = &zUri[nLen];
	 sxu8 bHostOnly = FALSE;
	 sxu8 bIPv6 = FALSE	; 
	 const char *zCur;
	 SyString *pComp;
	 sxu32 nPos = 0;
	 sxi32 rc;
	 /* Zero the structure first */
	 SyZero(pOut, sizeof(SyhttpUri));
	 /* Remove leading and trailing white spaces  */
	 SyStringInitFromBuf(&pOut->sRaw, zUri, nLen);
	 SyStringFullTrim(&pOut->sRaw);
	 /* Find the first '/' separator */
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc != SXRET_OK ){
		 /* Assume a host name only */
		 zCur = zEnd;
		 bHostOnly = TRUE;
		 goto ProcessHost;
	 }
	 zCur = &zUri[nPos];
	 if( zUri != zCur && zCur[-1] == ':' ){
		 /* Extract a scheme:
		  * Not that we can get an invalid scheme here.
		  * Fortunately the caller can discard any URI by comparing this scheme with its 
		  * registered schemes and will report the error as soon as his comparison function
		  * fail.
		  */
	 	pComp = &pOut->sScheme;
		SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri - 1));
		SyStringLeftTrim(pComp);		
	 }
	 if( zCur[1] != '/' ){
		 if( zCur == zUri || zCur[-1] == ':' ){
		  /* No authority */
		  goto PathSplit;
		}
		 /* There is something here , we will assume its an authority
		  * and someone has forgot the two prefix slashes "//", 
		  * sooner or later we will detect if we are dealing with a malicious
		  * user or not, but now assume we are dealing with an authority
		  * and let the caller handle all the validation process.
		  */
		 goto ProcessHost;
	 }	 
	 zUri = &zCur[2];
	 zCur = zEnd;
	 rc = SyByteFind(zUri, (sxu32)(zEnd - zUri), '/', &nPos);
	 if( rc == SXRET_OK ){
		 zCur = &zUri[nPos];
	 }
 ProcessHost:
	 /* Extract user information if present */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), '@', &nPos);
	 if( rc == SXRET_OK ){
		 if( nPos > 0 ){
			 sxu32 nPassOfft; /* Password offset */
			 pComp = &pOut->sUser;
			 SyStringInitFromBuf(pComp, zUri, nPos);
			 /* Extract the password if available */
			 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPassOfft);
			 if( rc == SXRET_OK && nPassOfft < nPos){
				 pComp->nByte = nPassOfft;
				 pComp = &pOut->sPass;
				 pComp->zString = &zUri[nPassOfft+sizeof(char)];
				 pComp->nByte = nPos - nPassOfft - 1;
			 }
			 /* Update the cursor */
			 zUri = &zUri[nPos+1];
		 }else{
			 zUri++;
		 }
	 }
	 pComp = &pOut->sHost;
	 while( zUri < zCur && SyisSpace(zUri[0])){
		 zUri++;
	 }	
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zCur - zUri));
	 if( pComp->zString[0] == '[' ){
		 /* An IPv6 Address: Make a simple naive test
		  */
		 zUri++; pComp->zString++; pComp->nByte = 0;
		 while( ((unsigned char)zUri[0] < 0xc0 && SyisHex(zUri[0])) || zUri[0] == ':' ){
			 zUri++; pComp->nByte++;
		 }
		 if( zUri[0] != ']' ){
			 return SXERR_CORRUPT; /* Malformed IPv6 address */
		 }
		 zUri++;
		 bIPv6 = TRUE;
	 }
	 /* Extract a port number if available */
	 rc = SyByteFind(zUri, (sxu32)(zCur - zUri), ':', &nPos);
	 if( rc == SXRET_OK ){
		 if( bIPv6 == FALSE ){
			 pComp->nByte = (sxu32)(&zUri[nPos] - zUri);
		 }
		 pComp = &pOut->sPort;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zCur - &zUri[nPos+1]));	
	 }
	 if( bHostOnly == TRUE ){
		 return SXRET_OK;
	 }
PathSplit:
	 zUri = zCur;
	 pComp = &pOut->sPath;
	 SyStringInitFromBuf(pComp, zUri, (sxu32)(zEnd-zUri));
	 if( pComp->nByte == 0 ){
		 return SXRET_OK; /* Empty path */
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '?', &nPos) ){
		 pComp->nByte = nPos; /* Update path length */
		 pComp = &pOut->sQuery;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]));
	 }
	 if( SXRET_OK == SyByteFind(zUri, (sxu32)(zEnd-zUri), '#', &nPos) ){
		 /* Update path or query length */
		 if( pComp == &pOut->sPath ){
			 pComp->nByte = nPos;
		 }else{
			 if( &zUri[nPos] < (char *)SyStringData(pComp) ){
				 /* Malformed syntax : Query must be present before fragment */
				 return SXERR_SYNTAX;
			 }
			 pComp->nByte -= (sxu32)(zEnd - &zUri[nPos]);
		 }
		 pComp = &pOut->sFragment;
		 SyStringInitFromBuf(pComp, &zUri[nPos+1], (sxu32)(zEnd-&zUri[nPos+1]))
	 }
	 return SXRET_OK;
 }